

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

CoinStatsHashType ParseHashType(string *hash_type_input)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  CoinStatsHashType local_2c;
  string *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0);
  if (bVar2) {
    local_2c = HASH_SERIALIZED;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa0);
    if (bVar2) {
      local_2c = MUHASH;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              in_stack_ffffffffffffffa0);
      if (!bVar2) {
        uVar3 = __cxa_allocate_exception(0x58);
        tinyformat::format<std::__cxx11::string>(in_RDI,in_stack_ffffffffffffffc0);
        JSONRPCError(in_stack_ffffffffffffffec,in_stack_ffffffffffffffd8);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_0126cf62;
      }
      local_2c = NONE;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
LAB_0126cf62:
  __stack_chk_fail();
}

Assistant:

CoinStatsHashType ParseHashType(const std::string& hash_type_input)
{
    if (hash_type_input == "hash_serialized_3") {
        return CoinStatsHashType::HASH_SERIALIZED;
    } else if (hash_type_input == "muhash") {
        return CoinStatsHashType::MUHASH;
    } else if (hash_type_input == "none") {
        return CoinStatsHashType::NONE;
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("'%s' is not a valid hash_type", hash_type_input));
    }
}